

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

MPP_RET vcodec_service_cmd_send(void *ctx)

{
  uint uVar1;
  void *regs;
  VcodecRegCfg *send_cfg_00;
  uint *puVar2;
  int *piVar3;
  char *pcVar4;
  MPP_RET *pMVar5;
  MPP_RET local_3c;
  MPP_RET ret;
  char *fmt;
  void *reg_set;
  VcodecExtraInfo *extra;
  VcodecRegCfg *send_cfg;
  MppDevVcodecService *p;
  void *ctx_local;
  
  send_cfg_00 = (VcodecRegCfg *)((long)ctx + (long)*(int *)((long)ctx + 0x1c) * 0xa0 + 0x28);
  regs = send_cfg_00->reg_set;
  update_extra_info(&send_cfg_00->extra_info,(char *)((long)ctx + 8),send_cfg_00);
  local_3c = vcodec_service_ioctl
                       (*(RK_S32 *)((long)ctx + 0x10),0x40086c03,regs,send_cfg_00->reg_size);
  if (local_3c != MPP_OK) {
    puVar2 = (uint *)__errno_location();
    uVar1 = *puVar2;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _mpp_log_l(2,"vcodec_service","ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
               "vcodec_service_cmd_send",(ulong)(uint)local_3c,(ulong)uVar1,pcVar4);
    pMVar5 = __errno_location();
    local_3c = *pMVar5;
  }
  *(int *)((long)ctx + 0x1c) = *(int *)((long)ctx + 0x1c) + 1;
  if (*(int *)((long)ctx + 0x14) <= *(int *)((long)ctx + 0x1c)) {
    *(undefined4 *)((long)ctx + 0x1c) = 0;
  }
  *(undefined4 *)((long)ctx + 0x208) = 0;
  return local_3c;
}

Assistant:

MPP_RET vcodec_service_cmd_send(void *ctx)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];
    VcodecExtraInfo *extra = &send_cfg->extra_info;
    void *reg_set = send_cfg->reg_set;
    char *fmt = (char*)&p->fmt;

    update_extra_info(extra, fmt, send_cfg);

    MPP_RET ret = vcodec_service_ioctl(p->fd, VPU_IOC_SET_REG,
                                       reg_set, send_cfg->reg_size);
    if (ret) {
        mpp_err_f("ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    p->reg_send_idx++;
    if (p->reg_send_idx >= p->max_regs)
        p->reg_send_idx = 0;
    p->info_count = 0;

    return ret;
}